

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O2

void __thiscall
TEST_AccountingTestMemoryAllocator_canAllocateAndAccountMemoryMultipleAllocations_Test::testBody
          (TEST_AccountingTestMemoryAllocator_canAllocateAndAccountMemoryMultipleAllocations_Test
           *this)

{
  AccountingTestMemoryAllocator *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  UtestShell *pUVar5;
  size_t sVar6;
  TestTerminator *pTVar7;
  MemoryAccountant *this_00;
  
  pAVar1 = (this->super_TEST_GROUP_CppUTestGroupAccountingTestMemoryAllocator).allocator;
  iVar2 = (*(pAVar1->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[2])
                    (pAVar1,10,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
                     ,0x23b);
  pAVar1 = (this->super_TEST_GROUP_CppUTestGroupAccountingTestMemoryAllocator).allocator;
  iVar3 = (*(pAVar1->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[2])
                    (pAVar1,8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
                     ,0x23c);
  pAVar1 = (this->super_TEST_GROUP_CppUTestGroupAccountingTestMemoryAllocator).allocator;
  iVar4 = (*(pAVar1->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[2])
                    (pAVar1,0xc,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
                     ,0x23d);
  pAVar1 = (this->super_TEST_GROUP_CppUTestGroupAccountingTestMemoryAllocator).allocator;
  (*(pAVar1->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[3])
            (pAVar1,CONCAT44(extraout_var,iVar2),10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x23f);
  pAVar1 = (this->super_TEST_GROUP_CppUTestGroupAccountingTestMemoryAllocator).allocator;
  (*(pAVar1->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[3])
            (pAVar1,CONCAT44(extraout_var_01,iVar4),0xc,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x240);
  pAVar1 = (this->super_TEST_GROUP_CppUTestGroupAccountingTestMemoryAllocator).allocator;
  iVar2 = (*(pAVar1->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[2])
                    (pAVar1,0xf,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
                     ,0x242);
  pAVar1 = (this->super_TEST_GROUP_CppUTestGroupAccountingTestMemoryAllocator).allocator;
  iVar4 = (*(pAVar1->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[2])
                    (pAVar1,0x14,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
                     ,0x243);
  pAVar1 = (this->super_TEST_GROUP_CppUTestGroupAccountingTestMemoryAllocator).allocator;
  (*(pAVar1->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[3])
            (pAVar1,CONCAT44(extraout_var_00,iVar3),8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x245);
  pAVar1 = (this->super_TEST_GROUP_CppUTestGroupAccountingTestMemoryAllocator).allocator;
  (*(pAVar1->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[3])
            (pAVar1,CONCAT44(extraout_var_02,iVar2),0xf,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x246);
  pAVar1 = (this->super_TEST_GROUP_CppUTestGroupAccountingTestMemoryAllocator).allocator;
  (*(pAVar1->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[3])
            (pAVar1,CONCAT44(extraout_var_03,iVar4),0x14,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x247);
  pAVar1 = (this->super_TEST_GROUP_CppUTestGroupAccountingTestMemoryAllocator).allocator;
  iVar2 = (*(pAVar1->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[2])
                    (pAVar1,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
                     ,0x249);
  pAVar1 = (this->super_TEST_GROUP_CppUTestGroupAccountingTestMemoryAllocator).allocator;
  iVar3 = (*(pAVar1->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[2])
                    (pAVar1,100,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
                     ,0x24a);
  pAVar1 = (this->super_TEST_GROUP_CppUTestGroupAccountingTestMemoryAllocator).allocator;
  (*(pAVar1->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[3])
            (pAVar1,CONCAT44(extraout_var_04,iVar2),1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x24c);
  pAVar1 = (this->super_TEST_GROUP_CppUTestGroupAccountingTestMemoryAllocator).allocator;
  (*(pAVar1->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[3])
            (pAVar1,CONCAT44(extraout_var_05,iVar3),100,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x24d);
  pUVar5 = UtestShell::getCurrent();
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupAccountingTestMemoryAllocator).accountant;
  sVar6 = MemoryAccountant::totalAllocations(this_00);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,7,sVar6,"LONGS_EQUAL(7, accountant.totalAllocations()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x24f,pTVar7);
  pUVar5 = UtestShell::getCurrent();
  sVar6 = MemoryAccountant::totalDeallocations(this_00);
  pTVar7 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,7,sVar6,"LONGS_EQUAL(7, accountant.totalDeallocations()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
             ,0x250,pTVar7);
  return;
}

Assistant:

TEST(AccountingTestMemoryAllocator, canAllocateAndAccountMemoryMultipleAllocations)
{
    char* memory1 = allocator->alloc_memory(10, __FILE__, __LINE__);
    char* memory2 = allocator->alloc_memory(8, __FILE__, __LINE__);
    char* memory3 = allocator->alloc_memory(12, __FILE__, __LINE__);

    allocator->free_memory(memory1, 10,  __FILE__, __LINE__);
    allocator->free_memory(memory3, 12,  __FILE__, __LINE__);

    char* memory4 = allocator->alloc_memory(15, __FILE__, __LINE__);
    char* memory5 = allocator->alloc_memory(20, __FILE__, __LINE__);

    allocator->free_memory(memory2, 8, __FILE__, __LINE__);
    allocator->free_memory(memory4, 15, __FILE__, __LINE__);
    allocator->free_memory(memory5, 20, __FILE__, __LINE__);

    char* memory6 = allocator->alloc_memory(1, __FILE__, __LINE__);
    char* memory7 = allocator->alloc_memory(100, __FILE__, __LINE__);

    allocator->free_memory(memory6, 1, __FILE__, __LINE__);
    allocator->free_memory(memory7, 100, __FILE__, __LINE__);

    LONGS_EQUAL(7, accountant.totalAllocations());
    LONGS_EQUAL(7, accountant.totalDeallocations());
}